

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lennard.c
# Opt level: O2

void LJ_Update_Velocity(void)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int ld;
  int hi;
  int lo;
  double *v;
  double *a;
  
  GA_Sync();
  NGA_Distribution(g_V,gMe,&lo,&hi);
  NGA_Access(g_V,&lo,&hi,&v,&ld);
  NGA_Access(g_G,&lo,&hi,&a,&ld);
  uVar1 = (long)((hi - lo) + 1) / 3;
  uVar3 = 0;
  uVar2 = uVar1 & 0xffffffff;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      v[lVar4] = a[lVar4] * 0.5 * gTimeStep + v[lVar4];
    }
    v = v + 3;
    a = a + 3;
  }
  GA_Sync();
  return;
}

Assistant:

void LJ_Update_Velocity() {
  int i, p, lo, hi, ld, natms;
  double *a, *v;
  
  GA_Sync();
  
  NGA_Distribution(g_V, gMe, &lo, &hi);
  NGA_Access(g_V, &lo, &hi, &v, &ld); 
  NGA_Access(g_G, &lo, &hi, &a, &ld); 
  
  natms = (hi-lo+1)/NDIM;
  for (p = 0; p < natms; p++)
    for (i = 0; i < NDIM; i++) 
      v[p*NDIM+i] += 0.5 * a[p*NDIM+i] * gTimeStep;

  GA_Sync();
}